

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gherkin_line.c
# Opt level: O0

Items * GherkinLine_table_cells(GherkinLine *line)

{
  wchar_t wVar1;
  wchar_t *pwVar2;
  wchar_t *local_40;
  wchar_t *current_pos;
  Items *item_array;
  wchar_t i;
  Span *items;
  wchar_t item_count;
  GherkinLine *line_local;
  
  wVar1 = calculate_cell_count(line->trimmed_line);
  if (wVar1 == L'\0') {
    line_local = (GherkinLine *)0x0;
  }
  else {
    pwVar2 = (wchar_t *)malloc((long)wVar1 << 4);
    for (item_array._4_4_ = L'\0'; item_array._4_4_ < wVar1;
        item_array._4_4_ = item_array._4_4_ + L'\x01') {
      pwVar2[(long)item_array._4_4_ * 4] = L'\0';
      (pwVar2 + (long)item_array._4_4_ * 4 + 2)[0] = L'\0';
      (pwVar2 + (long)item_array._4_4_ * 4 + 2)[1] = L'\0';
    }
    line_local = (GherkinLine *)malloc(0x10);
    line_local->line_number = wVar1;
    line_local->line_text = pwVar2;
    local_40 = line->trimmed_line;
    item_array._4_4_ = L'\0';
    while ((item_array._4_4_ < wVar1 &&
           (local_40 = populate_cell_data((Span *)(pwVar2 + (long)item_array._4_4_ * 4),local_40,
                                          (wchar_t)((long)local_40 - (long)line->line_text >> 2)),
           local_40 != (wchar_t *)0x0))) {
      item_array._4_4_ = item_array._4_4_ + L'\x01';
    }
  }
  return (Items *)line_local;
}

Assistant:

const Items* GherkinLine_table_cells(const GherkinLine* line) {
    int item_count = calculate_cell_count(line->trimmed_line);
    if (item_count == 0)
        return (Items*)0;
    Span* items = (Span*)malloc(item_count * sizeof(Span));
    int i;
    for (i = 0; i < item_count; ++i) {
        items[i].column = 0;
        items[i].text = 0;
    }
    Items* item_array = (Items*)malloc(sizeof(Items));
    item_array->count = item_count;
    item_array->items = items;
    const wchar_t* current_pos = line->trimmed_line;
    for (i = 0; i < item_count; ++i) {
        current_pos = populate_cell_data(&items[i], current_pos, current_pos - line->line_text);
        if (!current_pos)
            break;
    }
    return item_array;
}